

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBoolReader.cpp
# Opt level: O2

void IBoolReader::getBlock(ifstream *ifs,string *str,string *blockName,bool type)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char cVar4;
  int i;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (uVar5 = 0; cVar4 = (char)str, uVar5 < blockName->_M_string_length; uVar5 = uVar5 + 1) {
    std::istream::get();
    std::__cxx11::string::push_back(cVar4);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
  bVar1 = std::operator!=(&local_50,blockName);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    while (cVar2 = std::istream::get(), cVar2 != -1) {
      std::__cxx11::string::push_back(cVar4);
      bVar1 = IDictionary::isBlankSep(cVar2);
      if (!bVar1) {
        if (!type) goto LAB_001096f1;
        if (cVar2 == '(') goto LAB_0010968d;
        goto LAB_00109795;
      }
      if (cVar2 == '\n') {
        std::__cxx11::string::push_back(cVar4);
      }
    }
    if (!type) goto LAB_001096f1;
  }
LAB_00109795:
  std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
  std::__cxx11::string::operator=((string *)str,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
  while (std::__cxx11::string::push_back(cVar4), iVar3 << 0x18 != 0x29000000) {
LAB_0010968d:
    iVar3 = std::istream::get();
    if (iVar3 << 0x18 == -0x1000000) break;
  }
  while( true ) {
    cVar2 = std::istream::get();
    bVar1 = IDictionary::isBlankSep(cVar2);
    if (!bVar1) break;
    std::__cxx11::string::push_back(cVar4);
    if (cVar2 == '\n') {
      std::__cxx11::string::push_back(cVar4);
    }
  }
LAB_001096f1:
  if (cVar2 == ';') {
    std::__cxx11::string::push_back(cVar4);
  }
  else if (cVar2 == '{') {
    if (type) {
      std::__cxx11::string::push_back(cVar4);
    }
    bVar1 = true;
    while ((iVar3 = std::istream::get(), bVar1 && (iVar3 = iVar3 << 0x18, iVar3 != -0x1000000))) {
      std::__cxx11::string::push_back(cVar4);
      if (iVar3 == 0x7d000000) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (iVar3 == 0xa000000) {
          std::__cxx11::string::push_back(cVar4);
          bVar1 = true;
        }
      }
    }
  }
  else {
    do {
      std::__cxx11::string::push_back(cVar4);
      cVar2 = std::istream::get();
    } while (cVar2 != ';');
  }
  return;
}

Assistant:

void IBoolReader::getBlock(std::ifstream* ifs,std::string &str, const std::string &blockName, bool type) {
    char tempChar;
    int num_3l;
    int base_len = str.length();

    for(int i=0;i<blockName.length();i++)
    {
        tempChar=ifs->get();
        str+=tempChar;
    }
    if(str.substr(str.length()-blockName.length(),blockName.length())!=blockName) {
        str = str.substr(0,base_len);
        return;
    }

    while((tempChar=ifs->get())!=EOF)
    {
        str+=tempChar;
        if(!IDictionary::isBlankSep(tempChar))
            break;
        if(tempChar=='\n')
            str+='\n';
    }

    if(type)
    {
        if (tempChar != '(') {
            str = str.substr(0, base_len);
            return;
        }
        while ((tempChar = ifs->get()) != EOF) {
            str += tempChar;
            if (tempChar == ')')
                break;
        }
        while (true) {
            tempChar = ifs->get();
            if (IDictionary::isBlankSep(tempChar)) {
                str += tempChar;
                if (tempChar == '\n')
                    str += '\n';
            } else
                break;
        }
    }

    if(tempChar=='{')
    {
        if(type)
            str+=tempChar;
        num_3l=1;

        while ((tempChar=ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
    else if(tempChar==';')
    {
        str+=tempChar;
        return;
    }
    else
    {
        do{
            str+=tempChar;
            tempChar=ifs->get();
        }while (tempChar!=';');
    }
}